

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_library_loader.hpp
# Opt level: O1

void __thiscall VulkanLibrary::VulkanLibrary(VulkanLibrary *this)

{
  void *pvVar1;
  PFN_vkGetInstanceProcAddr p_Var2;
  
  this->vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)0x0;
  this->vkGetDeviceProcAddr = (PFN_vkGetDeviceProcAddr)0x0;
  pvVar1 = (void *)dlopen("libvulkan.so.1",2);
  this->library = pvVar1;
  if (pvVar1 == (void *)0x0) {
    pvVar1 = (void *)dlopen("libvulkan.so",2);
    this->library = pvVar1;
  }
  if (this->library != (void *)0x0) {
    p_Var2 = (PFN_vkGetInstanceProcAddr)dlsym(this->library,"vkGetInstanceProcAddr");
    this->vkGetInstanceProcAddr = p_Var2;
  }
  return;
}

Assistant:

VulkanLibrary() {
#if defined(__linux__) || defined(__FreeBSD__)
        library = dlopen("libvulkan.so.1", RTLD_NOW | RTLD_LOCAL);
        if (!library) library = dlopen("libvulkan.so", RTLD_NOW | RTLD_LOCAL);
#elif defined(__APPLE__)
        library = dlopen("libvulkan.dylib", RTLD_NOW | RTLD_LOCAL);
        if (!library) library = dlopen("libvulkan.1.dylib", RTLD_NOW | RTLD_LOCAL);
#elif defined(_WIN32)
        library = LoadLibrary(TEXT("vulkan-1.dll"));
#else
        assert(false && "Unsupported platform");
#endif
        if (!library) return;
#if defined(__linux__) || defined(__APPLE__) || defined(__FreeBSD__)
        vkGetInstanceProcAddr = reinterpret_cast<PFN_vkGetInstanceProcAddr>(dlsym(library, "vkGetInstanceProcAddr"));
#elif defined(_WIN32)
        vkGetInstanceProcAddr = reinterpret_cast<PFN_vkGetInstanceProcAddr>(GetProcAddress(library, "vkGetInstanceProcAddr"));
#endif
    }